

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_iterators.h
# Opt level: O0

void __thiscall
Gudhi::
Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>::
increment(Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
          *this)

{
  bool bVar1;
  Vertex_handle VVar2;
  pointer ppVar3;
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  undefined1 local_30 [8];
  reverse_iterator rit;
  Siblings *new_sib;
  Siblings *for_sib;
  undefined8 local_10;
  Simplex_tree_boundary_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  *this_local;
  
  local_10 = this;
  if (this->sib_ == (Siblings *)0x0) {
    Simplex_tree<Gudhi::Simplex_tree_options_default>::null_simplex();
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::operator=(&this->sh_,
                (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                 *)&for_sib);
  }
  else {
    new_sib = this->sib_;
    rit.m_current.m_ptr =
         (vec_iterator<int_*,_false>)
         Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
         ::oncles(this->sib_);
    boost::container::
    vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>::rbegin
              ((vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                *)local_30);
    while( true ) {
      boost::container::
      vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>::rend
                ((vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                  *)local_38);
      bVar1 = boost::intrusive::operator!=
                        ((reverse_iterator<boost::container::vec_iterator<int_*,_false>_> *)local_30
                         ,(reverse_iterator<boost::container::vec_iterator<int_*,_false>_> *)
                          local_38);
      if (!bVar1) break;
      boost::intrusive::reverse_iterator<boost::container::vec_iterator<int_*,_false>_>::operator*
                ((reverse_iterator<boost::container::vec_iterator<int_*,_false>_> *)local_30);
      Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
      ::find((Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
              *)local_40,(Vertex_handle)new_sib);
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
      ::operator=(&this->sh_,
                  (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                   *)local_40);
      ppVar3 = boost::container::
               vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
               ::operator->(&this->sh_);
      new_sib = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
                ::children(&ppVar3->second);
      boost::intrusive::reverse_iterator<boost::container::vec_iterator<int_*,_false>_>::operator++
                ((reverse_iterator<boost::container::vec_iterator<int_*,_false>_> *)local_30);
    }
    Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
    ::find((Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
            *)local_48,(Vertex_handle)new_sib);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
    ::operator=(&this->sh_,
                (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                 *)local_48);
    boost::container::
    vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>::
    push_back(&(this->suffix_).
               super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
              ,&this->next_);
    VVar2 = Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
            ::parent(this->sib_);
    this->next_ = VVar2;
    this->sib_ = (Siblings *)rit.m_current.m_ptr;
  }
  return;
}

Assistant:

void increment() {
    if (sib_ == nullptr) {
      sh_ = st_->null_simplex();
      return;
    }

    Siblings const* for_sib = sib_;
    Siblings const* new_sib = sib_->oncles();
    auto rit = suffix_.rbegin();
    if constexpr (SimplexTree::Options::contiguous_vertices && !SimplexTree::Options::stable_simplex_handles) {
      if (new_sib == nullptr) {
        // We reached the root, use a short-cut to find a vertex.
        if (rit == suffix_.rend()) {
          // Segment, this vertex is the last boundary simplex
          sh_ = for_sib->members_.begin() + last_;
          sib_ = nullptr;
          return;
        } else {
          // Dim >= 2, initial step of the descent
          sh_ = for_sib->members_.begin() + *rit;
          for_sib = sh_->second.children();
          ++rit;
        }
      }
    }

    for (; rit != suffix_.rend(); ++rit) {
      sh_ = for_sib->find(*rit);
      for_sib = sh_->second.children();
    }
    sh_ = for_sib->find(last_);  // sh_ points to the right simplex now
    suffix_.push_back(next_);
    next_ = sib_->parent();
    sib_ = new_sib;
  }